

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListIteratorTest_begin_end_forward_Test::TestBody
          (IntrusiveListIteratorTest_begin_end_forward_Test *this)

{
  IntrusiveListIteratorTest *this_00;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar1;
  undefined1 auVar2 [16];
  undefined8 *puVar3;
  TestObject *pTVar4;
  pointer *__ptr;
  pointer pcVar5;
  vector<int,_std::allocator<int>_> *in_R9;
  pointer *__ptr_1;
  const_iterator first;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  unsigned_long local_60;
  undefined8 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  long local_48;
  IntrusiveListIteratorTest_begin_end_forward_Test *local_40;
  AssertHelper local_38;
  
  pTVar4 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_40 = this;
  puVar3 = (undefined8 *)operator_new(0xc);
  *puVar3 = &DAT_200000001;
  *(undefined4 *)(puVar3 + 1) = 3;
  local_60 = 0;
  if (pTVar4 != (TestObject *)0x0) {
    do {
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_58,"expected[count]","first->data",
                 (int *)((long)puVar3 + local_60 * 4),&pTVar4->data);
      if (local_58._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar5 = "";
        }
        else {
          pcVar5 = (pbStack_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
                   ,0xa1,pcVar5);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
        goto joined_r0x0014b632;
      }
      if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_50,pbStack_50);
      }
      pTVar4 = (pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      local_60 = local_60 + 1;
    } while (pTVar4 != (TestObject *)0x0);
  }
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_58,"count","expected.size()",&local_60,(unsigned_long *)&local_68);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
               ,0xa5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
joined_r0x0014b632:
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  operator_delete(puVar3,0xc);
  this_00 = (IntrusiveListIteratorTest *)(local_40->super_IntrusiveListIteratorTest).clist_;
  piVar1 = (intrusive_list<(anonymous_namespace)::TestObject> *)
           (this_00->super_IntrusiveListTest).super_Test._vptr_Test;
  local_58 = (undefined8 *)0x0;
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = 0;
  puVar3 = (undefined8 *)operator_new(0xc);
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)puVar3 + 0xc);
  *puVar3 = &DAT_200000001;
  *(undefined4 *)(puVar3 + 1) = 3;
  first.node_ = (TestObject *)this_00;
  first.list_ = piVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = &local_58;
  local_58 = puVar3;
  local_48 = (long)pbStack_50;
  anon_unknown.dwarf_68f06::IntrusiveListIteratorTest::
  TestForward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
            (this_00,first,(const_iterator)(auVar2 << 0x40),in_R9);
  operator_delete(puVar3,0xc);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, begin_end_forward) {
  TestForward(list_.begin(), list_.end(), {1, 2, 3});
  TestForward(clist_.begin(), clist_.end(), {1, 2, 3});
}